

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O2

int compare_update_operations(void *a,void *b)

{
  int iVar1;
  long in_FS_OFFSET;
  
  if (*(uint *)((long)a + 0x10) < *(uint *)((long)b + 0x10)) {
    iVar1 = -1;
  }
  else {
    iVar1 = 1;
    if (*(uint *)((long)a + 0x10) <= *(uint *)((long)b + 0x10)) {
      if (*a <= *b) {
        iVar1 = -(uint)(*a < *b);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int compare_update_operations(const void *a, const void *b)
{
	const struct aspa_update_operation *op1 = a;
	const struct aspa_update_operation *op2 = b;

	// compare index in case customer ASNs match, so result is stable
	if (op1->record.customer_asn < op2->record.customer_asn)
		return -1;
	else if (op1->record.customer_asn > op2->record.customer_asn)
		return 1;
	else if (op1->index > op2->index)
		return 1;
	else if (op1->index < op2->index)
		return -1;
	else
		return 0;
}